

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenLoad(BinaryenModuleRef module,uint32_t bytes,bool signed_,uint32_t offset,uint32_t align,
            BinaryenType type,BinaryenExpressionRef ptr,char *memoryName)

{
  byte bVar1;
  uint32_t bytes_00;
  Load *pLVar2;
  Name memory;
  uint32_t local_5c;
  Type local_40;
  Address local_38;
  Builder local_30;
  BinaryenType local_28;
  BinaryenType type_local;
  uint32_t align_local;
  uint32_t offset_local;
  bool signed__local;
  BinaryenModuleRef pMStack_10;
  uint32_t bytes_local;
  BinaryenModuleRef module_local;
  
  local_28 = type;
  type_local._0_4_ = align;
  type_local._4_4_ = offset;
  align_local._3_1_ = signed_;
  offset_local = bytes;
  pMStack_10 = module;
  wasm::Builder::Builder(&local_30,module);
  bytes_00 = offset_local;
  bVar1 = align_local._3_1_;
  wasm::Address::Address(&local_38,(ulong)type_local._4_4_);
  if ((uint32_t)type_local == 0) {
    local_5c = offset_local;
  }
  else {
    local_5c = (uint32_t)type_local;
  }
  wasm::Type::Type(&local_40,local_28);
  memory = getMemoryName(pMStack_10,memoryName);
  pLVar2 = wasm::Builder::makeLoad
                     (&local_30,bytes_00,(bool)(bVar1 & 1),local_38,local_5c,ptr,local_40,memory);
  return (BinaryenExpressionRef)pLVar2;
}

Assistant:

BinaryenExpressionRef BinaryenLoad(BinaryenModuleRef module,
                                   uint32_t bytes,
                                   bool signed_,
                                   uint32_t offset,
                                   uint32_t align,
                                   BinaryenType type,
                                   BinaryenExpressionRef ptr,
                                   const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeLoad(bytes,
                !!signed_,
                offset,
                align ? align : bytes,
                (Expression*)ptr,
                Type(type),
                getMemoryName(module, memoryName)));
}